

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_string *
pugi::impl::anon_unknown_0::convert_number_to_string(double value,xpath_allocator *alloc)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  xpath_string *in_RDI;
  double in_XMM0_Qa;
  char_t *s;
  char_t *result;
  size_t result_size;
  int exponent;
  char *mantissa;
  char mantissa_buffer [32];
  char_t *special;
  char_t *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int iVar4;
  xpath_string *out_exponent;
  char **in_stack_ffffffffffffffa0;
  char (*in_stack_ffffffffffffffa8) [32];
  double in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  char *local_40;
  char local_38 [32];
  char_t *local_18;
  double local_8;
  
  out_exponent = in_RDI;
  local_8 = in_XMM0_Qa;
  local_18 = convert_number_to_string_special(in_XMM0_Qa);
  if (local_18 == (char_t *)0x0) {
    convert_number_to_mantissa_exponent
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
               (int *)out_exponent);
    sVar1 = strlen(local_38);
    iVar4 = in_stack_ffffffffffffffbc;
    if (in_stack_ffffffffffffffbc < 1) {
      iVar4 = -in_stack_ffffffffffffffbc;
    }
    pcVar2 = (char *)xpath_allocator::allocate
                               ((xpath_allocator *)
                                CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                sVar1 + (long)iVar4 + 4);
    if (pcVar2 == (char *)0x0) {
      xpath_string::xpath_string(in_RDI);
    }
    else {
      pcVar3 = pcVar2;
      if (local_8 < 0.0) {
        pcVar3 = pcVar2 + 1;
        *pcVar2 = '-';
      }
      if (in_stack_ffffffffffffffbc < 1) {
        *pcVar3 = '0';
        pcVar3 = pcVar3 + 1;
      }
      else {
        for (; 0 < in_stack_ffffffffffffffbc;
            in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc + -1) {
          if (*local_40 == '\0') {
            in_stack_ffffffffffffff80 = CONCAT13(0x30,(int3)in_stack_ffffffffffffff80);
          }
          else {
            in_stack_ffffffffffffff80 = CONCAT13(*local_40,(int3)in_stack_ffffffffffffff80);
            local_40 = local_40 + 1;
          }
          *pcVar3 = (char)((uint)in_stack_ffffffffffffff80 >> 0x18);
          pcVar3 = pcVar3 + 1;
        }
      }
      if (*local_40 != '\0') {
        *pcVar3 = '.';
        for (; pcVar3 = pcVar3 + 1, in_stack_ffffffffffffffbc < 0;
            in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc + 1) {
          *pcVar3 = '0';
        }
        while (*local_40 != '\0') {
          *pcVar3 = *local_40;
          pcVar3 = pcVar3 + 1;
          local_40 = local_40 + 1;
        }
      }
      *pcVar3 = '\0';
      xpath_string::from_heap_preallocated
                ((char_t *)CONCAT44(iVar4,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78);
    }
  }
  else {
    xpath_string::from_const
              ((char_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  }
  return out_exponent;
}

Assistant:

PUGI_IMPL_FN xpath_string convert_number_to_string(double value, xpath_allocator* alloc)
	{
		// try special number conversion
		const char_t* special = convert_number_to_string_special(value);
		if (special) return xpath_string::from_const(special);

		// get mantissa + exponent form
		char mantissa_buffer[32];

		char* mantissa;
		int exponent;
		convert_number_to_mantissa_exponent(value, mantissa_buffer, &mantissa, &exponent);

		// allocate a buffer of suitable length for the number
		size_t result_size = strlen(mantissa_buffer) + (exponent > 0 ? exponent : -exponent) + 4;
		char_t* result = static_cast<char_t*>(alloc->allocate(sizeof(char_t) * result_size));
		if (!result) return xpath_string();

		// make the number!
		char_t* s = result;

		// sign
		if (value < 0) *s++ = '-';

		// integer part
		if (exponent <= 0)
		{
			*s++ = '0';
		}
		else
		{
			while (exponent > 0)
			{
				assert(*mantissa == 0 || static_cast<unsigned int>(*mantissa - '0') <= 9);
				*s++ = *mantissa ? *mantissa++ : '0';
				exponent--;
			}
		}

		// fractional part
		if (*mantissa)
		{
			// decimal point
			*s++ = '.';

			// extra zeroes from negative exponent
			while (exponent < 0)
			{
				*s++ = '0';
				exponent++;
			}

			// extra mantissa digits
			while (*mantissa)
			{
				assert(static_cast<unsigned int>(*mantissa - '0') <= 9);
				*s++ = *mantissa++;
			}
		}

		// zero-terminate
		assert(s < result + result_size);
		*s = 0;

		return xpath_string::from_heap_preallocated(result, s);
	}